

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CodedInputStream::PrintTotalBytesLimitError(CodedInputStream *this)

{
  LogMessage *pLVar1;
  LogMessage local_28;
  Voidify local_11;
  CodedInputStream *local_10;
  CodedInputStream *this_local;
  
  local_10 = this;
  absl::lts_20250127::log_internal::LogMessage::LogMessage
            (&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.cc"
             ,0xbf);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [67])
                             "A protocol message was rejected because it was too big (more than ");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,this->total_bytes_limit_)
  ;
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar1,(char (*) [150])
                             " bytes).  To increase the limit (or to disable these warnings), see CodedInputStream::SetTotalBytesLimit() in third_party/protobuf/io/coded_stream.h."
                     );
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar1);
  absl::lts_20250127::log_internal::LogMessage::~LogMessage(&local_28);
  return;
}

Assistant:

void CodedInputStream::PrintTotalBytesLimitError() {
  ABSL_LOG(ERROR) << "A protocol message was rejected because it was too "
                     "big (more than "
                  << total_bytes_limit_
                  << " bytes).  To increase the limit (or to disable these "
                     "warnings), see CodedInputStream::SetTotalBytesLimit() "
                     "in third_party/protobuf/io/coded_stream.h.";
}